

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

void __thiscall Buffer::Members::Members(Members *this,size_t size,uchar *buf,bool own_memory)

{
  uchar *local_70;
  bool own_memory_local;
  uchar *buf_local;
  size_t size_local;
  Members *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->own_memory = own_memory;
  this->size = size;
  this->buf = (uchar *)0x0;
  if (own_memory) {
    if (size == 0) {
      local_70 = (uchar *)0x0;
    }
    else {
      local_70 = (uchar *)operator_new__(size);
    }
    this->buf = local_70;
  }
  else {
    this->buf = buf;
  }
  return;
}

Assistant:

Buffer::Members::Members(size_t size, unsigned char* buf, bool own_memory) :
    own_memory(own_memory),
    size(size),
    buf(nullptr)
{
    if (own_memory) {
        this->buf = (size ? new unsigned char[size] : nullptr);
    } else {
        this->buf = buf;
    }
}